

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unames.cpp
# Opt level: O0

UBool icu_63::compareName(UCharNames *names,uint8_t *name,uint16_t nameLength,
                         UCharNameChoice nameChoice,char *otherName)

{
  byte bVar1;
  char cVar2;
  ushort uVar3;
  uint16_t uVar4;
  byte *pbVar5;
  UCharNameChoice local_6c;
  char *local_68;
  uint8_t *tokenString;
  int fieldIndex;
  char *origOtherName;
  uint8_t c;
  uint8_t *tokenStrings;
  uint16_t tokenCount;
  uint16_t token;
  uint16_t *tokens;
  char *otherName_local;
  UCharNameChoice nameChoice_local;
  uint16_t nameLength_local;
  uint8_t *name_local;
  UCharNames *names_local;
  
  uVar3 = (ushort)names[1].tokenStringOffset;
  tokens = (uint16_t *)otherName;
  otherName_local._6_2_ = nameLength;
  _nameChoice_local = name;
  if ((nameChoice != U_UNICODE_CHAR_NAME) &&
     (tokens = (uint16_t *)otherName, otherName_local._6_2_ = nameLength, _nameChoice_local = name,
     nameChoice != U_EXTENDED_CHAR_NAME)) {
    if ((uVar3 < 0x3c) || ((short)names[8].groupStringOffset == -1)) {
      local_6c = nameChoice;
      if (nameChoice == U_CHAR_NAME_CHOICE_COUNT) {
        local_6c = U_EXTENDED_CHAR_NAME;
      }
      tokenString._4_4_ = local_6c;
      otherName_local._6_2_ = nameLength;
      _nameChoice_local = name;
LAB_0041c893:
      do {
        if (otherName_local._6_2_ != 0) {
          otherName_local._6_2_ = otherName_local._6_2_ - 1;
          pbVar5 = _nameChoice_local + 1;
          bVar1 = *_nameChoice_local;
          _nameChoice_local = pbVar5;
          if (bVar1 != 0x3b) goto LAB_0041c893;
        }
        tokenString._4_4_ = tokenString._4_4_ - U_UNICODE_10_CHAR_NAME;
        tokens = (uint16_t *)otherName;
      } while (0 < (int)tokenString._4_4_);
    }
    else {
      otherName_local._6_2_ = 0;
      tokens = (uint16_t *)otherName;
      _nameChoice_local = name;
    }
  }
  while (otherName_local._6_2_ != 0) {
    pbVar5 = _nameChoice_local + 1;
    bVar1 = *_nameChoice_local;
    if (bVar1 < uVar3) {
      tokenStrings._6_2_ = *(ushort *)((long)&names[1].tokenStringOffset + (ulong)bVar1 * 2 + 2);
      uVar4 = otherName_local._6_2_ - 1;
      if (tokenStrings._6_2_ == 0xfffe) {
        tokenStrings._6_2_ =
             *(ushort *)
              ((long)&names[1].tokenStringOffset + (long)(int)(uint)CONCAT11(bVar1,*pbVar5) * 2 + 2)
        ;
        uVar4 = otherName_local._6_2_ - 2;
        pbVar5 = _nameChoice_local + 2;
      }
      _nameChoice_local = pbVar5;
      otherName_local._6_2_ = uVar4;
      if (tokenStrings._6_2_ == 0xffff) {
        if (bVar1 == 0x3b) {
          if (((tokens != (uint16_t *)otherName) || (nameChoice != U_EXTENDED_CHAR_NAME)) ||
             ((0x3b < uVar3 && ((short)names[8].groupStringOffset != -1)))) break;
        }
        else {
          uVar4 = *tokens;
          tokens = (uint16_t *)((long)tokens + 1);
          if (bVar1 != (byte)uVar4) {
            return '\0';
          }
        }
      }
      else {
        local_68 = (char *)((long)&names->tokenStringOffset +
                           (long)(int)(uint)tokenStrings._6_2_ + (ulong)names->tokenStringOffset);
        while( true ) {
          cVar2 = *local_68;
          if (cVar2 == '\0') break;
          uVar4 = *tokens;
          local_68 = local_68 + 1;
          tokens = (uint16_t *)((long)tokens + 1);
          if (cVar2 != (char)uVar4) {
            return '\0';
          }
        }
      }
    }
    else {
      if (bVar1 == 0x3b) break;
      uVar4 = *tokens;
      tokens = (uint16_t *)((long)tokens + 1);
      otherName_local._6_2_ = otherName_local._6_2_ - 1;
      _nameChoice_local = pbVar5;
      if (bVar1 != (byte)uVar4) {
        return '\0';
      }
    }
  }
  return (char)*tokens == '\0';
}

Assistant:

static UBool
compareName(UCharNames *names,
            const uint8_t *name, uint16_t nameLength, UCharNameChoice nameChoice,
            const char *otherName) {
    uint16_t *tokens=(uint16_t *)names+8;
    uint16_t token, tokenCount=*tokens++;
    uint8_t *tokenStrings=(uint8_t *)names+names->tokenStringOffset;
    uint8_t c;
    const char *origOtherName = otherName;

    if(nameChoice!=U_UNICODE_CHAR_NAME && nameChoice!=U_EXTENDED_CHAR_NAME) {
        /*
         * skip the modern name if it is not requested _and_
         * if the semicolon byte value is a character, not a token number
         */
        if((uint8_t)';'>=tokenCount || tokens[(uint8_t)';']==(uint16_t)(-1)) {
            int fieldIndex= nameChoice==U_ISO_COMMENT ? 2 : nameChoice;
            do {
                while(nameLength>0) {
                    --nameLength;
                    if(*name++==';') {
                        break;
                    }
                }
            } while(--fieldIndex>0);
        } else {
            /*
             * the semicolon byte value is a token number, therefore
             * only modern names are stored in unames.dat and there is no
             * such requested alternate name here
             */
            nameLength=0;
        }
    }

    /* compare each letter directly, and compare a token word per token */
    while(nameLength>0) {
        --nameLength;
        c=*name++;

        if(c>=tokenCount) {
            if(c!=';') {
                /* implicit letter */
                if((char)c!=*otherName++) {
                    return FALSE;
                }
            } else {
                /* finished */
                break;
            }
        } else {
            token=tokens[c];
            if(token==(uint16_t)(-2)) {
                /* this is a lead byte for a double-byte token */
                token=tokens[c<<8|*name++];
                --nameLength;
            }
            if(token==(uint16_t)(-1)) {
                if(c!=';') {
                    /* explicit letter */
                    if((char)c!=*otherName++) {
                        return FALSE;
                    }
                } else {
                    /* stop, but skip the semicolon if we are seeking
                       extended names and there was no 2.0 name but there
                       is a 1.0 name. */
                    if(otherName == origOtherName && nameChoice == U_EXTENDED_CHAR_NAME) {
                        if ((uint8_t)';'>=tokenCount || tokens[(uint8_t)';']==(uint16_t)(-1)) {
                            continue;
                        }
                    }
                    /* finished */
                    break;
                }
            } else {
                /* write token word */
                uint8_t *tokenString=tokenStrings+token;
                while((c=*tokenString++)!=0) {
                    if((char)c!=*otherName++) {
                        return FALSE;
                    }
                }
            }
        }
    }

    /* complete match? */
    return (UBool)(*otherName==0);
}